

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O2

bool qt_isect_curve_horizontal(QBezier *bezier,qreal y,qreal x1,qreal x2,int depth)

{
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  pair<QBezier,_QBezier> halves;
  QBezier local_c8;
  QBezier local_88;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0xffffffff;
  uStack_34 = 0xffffffff;
  uStack_30 = 0xffffffff;
  uStack_2c = 0xffffffff;
  local_48 = 0xffffffff;
  uStack_44 = 0xffffffff;
  uStack_40 = 0xffffffff;
  uStack_3c = 0xffffffff;
  QBezier::bounds(bezier);
  if (((((double)CONCAT44(uStack_3c,uStack_40) <= y) &&
       (y < (double)CONCAT44(uStack_3c,uStack_40) + (double)CONCAT44(uStack_2c,uStack_30))) &&
      ((double)CONCAT44(uStack_44,local_48) < x2)) &&
     (x1 <= (double)CONCAT44(uStack_44,local_48) + (double)CONCAT44(uStack_34,local_38))) {
    bVar2 = true;
    if ((depth == 0x20) ||
       (((double)CONCAT44(uStack_2c,uStack_30) < 0.01 &&
        ((double)CONCAT44(uStack_34,local_38) < 0.01)))) goto LAB_00399781;
    local_88.x4._0_4_ = 0xffffffff;
    local_88.x4._4_4_ = 0xffffffff;
    local_88.y4._0_4_ = 0xffffffff;
    local_88.y4._4_4_ = 0xffffffff;
    local_88.x3._0_4_ = 0xffffffff;
    local_88.x3._4_4_ = 0xffffffff;
    local_88.y3._0_4_ = 0xffffffff;
    local_88.y3._4_4_ = 0xffffffff;
    local_88.x2._0_4_ = 0xffffffff;
    local_88.x2._4_4_ = 0xffffffff;
    local_88.y2._0_4_ = 0xffffffff;
    local_88.y2._4_4_ = 0xffffffff;
    local_88.x1._0_4_ = 0xffffffff;
    local_88.x1._4_4_ = 0xffffffff;
    local_88.y1._0_4_ = 0xffffffff;
    local_88.y1._4_4_ = 0xffffffff;
    local_c8.x4._0_4_ = 0xffffffff;
    local_c8.x4._4_4_ = 0xffffffff;
    local_c8.y4._0_4_ = 0xffffffff;
    local_c8.y4._4_4_ = 0xffffffff;
    local_c8.x3._0_4_ = 0xffffffff;
    local_c8.x3._4_4_ = 0xffffffff;
    local_c8.y3._0_4_ = 0xffffffff;
    local_c8.y3._4_4_ = 0xffffffff;
    local_c8.x2._0_4_ = 0xffffffff;
    local_c8.x2._4_4_ = 0xffffffff;
    local_c8.y2._0_4_ = 0xffffffff;
    local_c8.y2._4_4_ = 0xffffffff;
    local_c8.x1._0_4_ = 0xffffffff;
    local_c8.x1._4_4_ = 0xffffffff;
    local_c8.y1._0_4_ = 0xffffffff;
    local_c8.y1._4_4_ = 0xffffffff;
    QBezier::split(bezier);
    bVar1 = qt_isect_curve_horizontal(&local_c8,y,x1,x2,depth + 1);
    if (bVar1) goto LAB_00399781;
    bVar1 = qt_isect_curve_horizontal(&local_88,y,x1,x2,depth + 1);
    if (bVar1) goto LAB_00399781;
  }
  bVar2 = false;
LAB_00399781:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool qt_isect_curve_horizontal(const QBezier &bezier, qreal y, qreal x1, qreal x2, int depth = 0)
{
    QRectF bounds = bezier.bounds();

    if (y >= bounds.top() && y < bounds.bottom()
        && bounds.right() >= x1 && bounds.left() < x2) {
        const qreal lower_bound = qreal(.01);
        if (depth == 32 || (bounds.width() < lower_bound && bounds.height() < lower_bound))
            return true;

        const auto halves = bezier.split();
        if (qt_isect_curve_horizontal(halves.first, y, x1, x2, depth + 1)
            || qt_isect_curve_horizontal(halves.second, y, x1, x2, depth + 1))
            return true;
    }
    return false;
}